

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O2

Cut_Cut_t * Cut_NodeUnionCuts(Cut_Man_t *p,Vec_Int_t *vNodes)

{
  uint uVar1;
  int Node;
  int iVar2;
  uint uVar3;
  int iVar4;
  abctime aVar5;
  Cut_Cut_t *pCVar6;
  Cut_Cut_t *pCVar7;
  abctime aVar8;
  Cut_Cut_t *pCVar9;
  int iVar10;
  Cut_Cut_t *local_118;
  Cut_List_t Super;
  
  uVar1 = p->pParams->nVarsMax;
  aVar5 = Abc_Clock();
  Cut_ListStart(&Super);
  local_118 = (Cut_Cut_t *)0x0;
  Node = Vec_IntEntry(vNodes,0);
  p->nNodeCuts = 1;
  p->vTemp->nSize = 0;
  iVar10 = 1;
  for (iVar4 = 0; iVar4 < vNodes->nSize; iVar4 = iVar4 + 1) {
    iVar2 = Vec_IntEntry(vNodes,iVar4);
    pCVar6 = Cut_NodeReadCutsNew(p,iVar2);
    Cut_NodeWriteCutsNew(p,iVar2,(Cut_Cut_t *)0x0);
    if (pCVar6 == (Cut_Cut_t *)0x0) {
      __assert_fail("pList",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/cut/cutNode.c"
                    ,700,"Cut_Cut_t *Cut_NodeUnionCuts(Cut_Man_t *, Vec_Int_t *)");
    }
    pCVar9 = pCVar6->pNext;
    pCVar6->pNext = (Cut_Cut_t *)0x0;
    if (iVar4 == 0) {
      Cut_ListAdd(&Super,pCVar6);
      local_118 = pCVar6;
    }
    else {
      Cut_CutRecycle(p,pCVar6);
    }
    if (pCVar9 != (Cut_Cut_t *)0x0) goto LAB_003a54a2;
    pCVar6 = (Cut_Cut_t *)0x0;
    while (pCVar7 = pCVar6, pCVar9 != (Cut_Cut_t *)0x0) {
      uVar3 = *(uint *)pCVar9;
      if (uVar3 >> 0x1c == uVar1) {
        Vec_PtrPush(p->vTemp,pCVar9);
        break;
      }
      if (p->pParams->fFilter == 0) {
LAB_003a5451:
        *(uint *)pCVar9 = (uVar3 & 0xff7fffff) + ((*(uint *)local_118 ^ uVar3) & 0x400000) * 2;
        pCVar6 = pCVar9->pNext;
        pCVar9->pNext = (Cut_Cut_t *)0x0;
        Cut_ListAdd(&Super,pCVar9);
        iVar2 = p->nNodeCuts + 1;
        p->nNodeCuts = iVar2;
        if (iVar2 == p->pParams->nKeepMax) {
          if (pCVar6 == (Cut_Cut_t *)0x0) {
            pCVar9 = (Cut_Cut_t *)0x0;
            goto LAB_003a55d5;
          }
          goto LAB_003a55ce;
        }
      }
      else {
        iVar2 = Cut_CutFilterOne(p,&Super,pCVar9);
        if (iVar2 == 0) {
          uVar3 = *(uint *)pCVar9;
          goto LAB_003a5451;
        }
      }
      pCVar6 = (Cut_Cut_t *)0x0;
      pCVar9 = pCVar7;
      if (pCVar7 != (Cut_Cut_t *)0x0) {
LAB_003a54a2:
        pCVar6 = pCVar9->pNext;
      }
    }
    iVar10 = iVar10 + 1;
  }
  for (iVar10 = 0; iVar10 < p->vTemp->nSize; iVar10 = iVar10 + 1) {
    pCVar6 = (Cut_Cut_t *)Vec_PtrEntry(p->vTemp,iVar10);
    if (pCVar6 != (Cut_Cut_t *)0x0) goto LAB_003a5581;
    pCVar9 = (Cut_Cut_t *)0x0;
    while (pCVar7 = pCVar9, pCVar6 != (Cut_Cut_t *)0x0) {
      if ((p->pParams->fFilter == 0) || (iVar4 = Cut_CutFilterOne(p,&Super,pCVar6), iVar4 == 0)) {
        *(uint *)pCVar6 =
             (*(uint *)pCVar6 & 0xff7fffff) +
             ((*(uint *)local_118 ^ *(uint *)pCVar6) & 0x400000) * 2;
        pCVar9 = pCVar6->pNext;
        pCVar6->pNext = (Cut_Cut_t *)0x0;
        Cut_ListAdd(&Super,pCVar6);
        iVar4 = p->nNodeCuts + 1;
        p->nNodeCuts = iVar4;
        if (iVar4 == p->pParams->nKeepMax) {
          if (pCVar9 == (Cut_Cut_t *)0x0) {
            pCVar6 = (Cut_Cut_t *)0x0;
            goto LAB_003a5668;
          }
          goto LAB_003a5661;
        }
      }
      pCVar9 = (Cut_Cut_t *)0x0;
      pCVar6 = pCVar7;
      if (pCVar7 != (Cut_Cut_t *)0x0) {
LAB_003a5581:
        pCVar9 = pCVar6->pNext;
      }
    }
  }
LAB_003a56cc:
  pCVar6 = Cut_NodeReadCutsNew(p,Node);
  if (pCVar6 != (Cut_Cut_t *)0x0) {
    __assert_fail("Cut_NodeReadCutsNew(p, Root) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/cut/cutNode.c"
                  ,0x303,"Cut_Cut_t *Cut_NodeUnionCuts(Cut_Man_t *, Vec_Int_t *)");
  }
  pCVar6 = Cut_ListFinish(&Super);
  Cut_NodeWriteCutsNew(p,Node,pCVar6);
  aVar8 = Abc_Clock();
  p->timeUnion = p->timeUnion + (aVar8 - aVar5);
  p->nNodes = (p->nNodes - vNodes->nSize) + 1;
  return pCVar6;
LAB_003a55ce:
  pCVar9 = pCVar6->pNext;
LAB_003a55d5:
  do {
    pCVar7 = pCVar9;
    if (pCVar6 == (Cut_Cut_t *)0x0) goto LAB_003a560c;
    Cut_CutRecycle(p,pCVar6);
    pCVar9 = (Cut_Cut_t *)0x0;
    pCVar6 = pCVar7;
  } while (pCVar7 == (Cut_Cut_t *)0x0);
  goto LAB_003a55ce;
LAB_003a560c:
  for (; iVar10 < vNodes->nSize; iVar10 = iVar10 + 1) {
    iVar4 = Vec_IntEntry(vNodes,iVar10);
    Cut_NodeFreeCuts(p,iVar4);
  }
  for (iVar10 = 0; iVar10 < p->vTemp->nSize; iVar10 = iVar10 + 1) {
    pCVar6 = (Cut_Cut_t *)Vec_PtrEntry(p->vTemp,iVar10);
    if (pCVar6 != (Cut_Cut_t *)0x0) goto LAB_003a5655;
    pCVar9 = (Cut_Cut_t *)0x0;
    while (pCVar7 = pCVar9, pCVar6 != (Cut_Cut_t *)0x0) {
      Cut_CutRecycle(p,pCVar6);
      pCVar9 = (Cut_Cut_t *)0x0;
      pCVar6 = pCVar7;
      if (pCVar7 != (Cut_Cut_t *)0x0) {
LAB_003a5655:
        pCVar9 = pCVar6->pNext;
      }
    }
  }
  goto LAB_003a56cc;
LAB_003a5661:
  pCVar6 = pCVar9->pNext;
LAB_003a5668:
  do {
    pCVar7 = pCVar6;
    if (pCVar9 == (Cut_Cut_t *)0x0) goto LAB_003a56bf;
    Cut_CutRecycle(p,pCVar9);
    pCVar6 = (Cut_Cut_t *)0x0;
    pCVar9 = pCVar7;
  } while (pCVar7 == (Cut_Cut_t *)0x0);
  goto LAB_003a5661;
LAB_003a56bf:
  while( true ) {
    iVar10 = iVar10 + 1;
    if (p->vTemp->nSize <= iVar10) break;
    pCVar6 = (Cut_Cut_t *)Vec_PtrEntry(p->vTemp,iVar10);
    if (pCVar6 != (Cut_Cut_t *)0x0) goto LAB_003a56b9;
    pCVar9 = (Cut_Cut_t *)0x0;
    while (pCVar7 = pCVar9, pCVar6 != (Cut_Cut_t *)0x0) {
      Cut_CutRecycle(p,pCVar6);
      pCVar9 = (Cut_Cut_t *)0x0;
      pCVar6 = pCVar7;
      if (pCVar7 != (Cut_Cut_t *)0x0) {
LAB_003a56b9:
        pCVar9 = pCVar6->pNext;
      }
    }
  }
  goto LAB_003a56cc;
}

Assistant:

Cut_Cut_t * Cut_NodeUnionCuts( Cut_Man_t * p, Vec_Int_t * vNodes )
{
    Cut_List_t Super, * pSuper = &Super;
    Cut_Cut_t * pList, * pListStart, * pCut, * pCut2;
    Cut_Cut_t * pTop = NULL; // Suppress "might be used uninitialized"
    int i, k, Node, Root, Limit = p->pParams->nVarsMax;
    abctime clk = Abc_Clock();

    // start the new list
    Cut_ListStart( pSuper );

    // remember the root node to save the resulting cuts
    Root = Vec_IntEntry( vNodes, 0 );
    p->nNodeCuts = 1;

    // collect small cuts first
    Vec_PtrClear( p->vTemp );
    Vec_IntForEachEntry( vNodes, Node, i )
    {
        // get the cuts of this node
        pList = Cut_NodeReadCutsNew( p, Node );
        Cut_NodeWriteCutsNew( p, Node, NULL );
        assert( pList );
        // remember the starting point
        pListStart = pList->pNext;
        pList->pNext = NULL;
        // save or recycle the elementary cut
        if ( i == 0 )
            Cut_ListAdd( pSuper, pList ), pTop = pList;
        else
            Cut_CutRecycle( p, pList );
        // save all the cuts that are smaller than the limit
        Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
        {
            if ( pCut->nLeaves == (unsigned)Limit )
            {
                Vec_PtrPush( p->vTemp, pCut );
                break;
            }
            // check containment
            if ( p->pParams->fFilter && Cut_CutFilterOne( p, pSuper, pCut ) )
                continue;
            // set the complemented bit by comparing the first cut with the current cut
            pCut->fCompl = pTop->fSimul ^ pCut->fSimul;
            pListStart = pCut->pNext;
            pCut->pNext = NULL;
            // add to the list
            Cut_ListAdd( pSuper, pCut );
            if ( ++p->nNodeCuts == p->pParams->nKeepMax )
            {
                // recycle the rest of the cuts of this node
                Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
                    Cut_CutRecycle( p, pCut );
                // recycle all cuts of other nodes
                Vec_IntForEachEntryStart( vNodes, Node, k, i+1 )
                    Cut_NodeFreeCuts( p, Node );
                // recycle the saved cuts of other nodes
                Vec_PtrForEachEntry( Cut_Cut_t *, p->vTemp, pList, k )
                    Cut_ListForEachCutSafe( pList, pCut, pCut2 )
                        Cut_CutRecycle( p, pCut );
                goto finish;
            }
        }
    } 
    // collect larger cuts next
    Vec_PtrForEachEntry( Cut_Cut_t *, p->vTemp, pList, i )
    {
        Cut_ListForEachCutSafe( pList, pCut, pCut2 )
        {
            // check containment
            if ( p->pParams->fFilter && Cut_CutFilterOne( p, pSuper, pCut ) )
                continue;
            // set the complemented bit
            pCut->fCompl = pTop->fSimul ^ pCut->fSimul;
            pListStart = pCut->pNext;
            pCut->pNext = NULL;
            // add to the list
            Cut_ListAdd( pSuper, pCut );
            if ( ++p->nNodeCuts == p->pParams->nKeepMax )
            {
                // recycle the rest of the cuts
                Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
                    Cut_CutRecycle( p, pCut );
                // recycle the saved cuts of other nodes
                Vec_PtrForEachEntryStart( Cut_Cut_t *, p->vTemp, pList, k, i+1 )
                    Cut_ListForEachCutSafe( pList, pCut, pCut2 )
                        Cut_CutRecycle( p, pCut );
                goto finish;
            }
        }
    }
finish :
    // set the cuts at the node
    assert( Cut_NodeReadCutsNew(p, Root) == NULL );
    pList = Cut_ListFinish( pSuper );
    Cut_NodeWriteCutsNew( p, Root, pList );
p->timeUnion += Abc_Clock() - clk;
    // filter the cuts
//clk = Abc_Clock();
//    if ( p->pParams->fFilter )
//        Cut_CutFilter( p, pList );
//p->timeFilter += Abc_Clock() - clk;
    p->nNodes -= vNodes->nSize - 1;
    return pList;
}